

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.c
# Opt level: O0

int load_iv(char **fromp,uchar *to,int num)

{
  int iVar1;
  uchar *func;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  char *from;
  int i;
  int v;
  int iVar2;
  uint line;
  
  func = (uchar *)*in_RDI;
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    *(undefined1 *)(in_RSI + iVar2) = 0;
  }
  iVar2 = in_EDX << 1;
  line = 0;
  while( true ) {
    if (iVar2 <= (int)line) {
      *in_RDI = func;
      return 1;
    }
    iVar1 = OPENSSL_hexchar2int(*func);
    if (iVar1 < 0) break;
    func = func + 1;
    *(byte *)(in_RSI + (int)line / 2) =
         *(byte *)(in_RSI + (int)line / 2) | (byte)(iVar1 << ((((line & 1) != 0 ^ 0xffU) & 1) << 2))
    ;
    line = line + 1;
  }
  ERR_new();
  ERR_set_debug((char *)CONCAT44(iVar2,iVar1),line,(char *)func);
  ERR_set_error(9,0x67,(char *)0x0);
  return 0;
}

Assistant:

static int load_iv(char **fromp, unsigned char *to, int num)
{
    int v, i;
    char *from;

    from = *fromp;
    for (i = 0; i < num; i++)
        to[i] = 0;
    num *= 2;
    for (i = 0; i < num; i++) {
        v = OPENSSL_hexchar2int(*from);
        if (v < 0) {
            ERR_raise(ERR_LIB_PEM, PEM_R_BAD_IV_CHARS);
            return 0;
        }
        from++;
        to[i / 2] |= v << (long)((!(i & 1)) * 4);
    }

    *fromp = from;
    return 1;
}